

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_execute.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,ExecuteStatement *stmt)

{
  LogicalType *this_00;
  ExpressionType EVar1;
  idx_t iVar2;
  ClientContext *pCVar3;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var4;
  element_type *peVar5;
  bool bVar6;
  int iVar7;
  ClientData *pCVar8;
  iterator iVar9;
  PreparedStatementData *pPVar10;
  pointer pSVar11;
  Binder *pBVar12;
  pointer pPVar13;
  type binder;
  pointer this_01;
  BoundConstantExpression *pBVar14;
  type expr;
  mapped_type *this_02;
  pointer this_03;
  ClientContextState *pCVar15;
  StatementProperties *this_04;
  pointer pLVar16;
  BinderException *this_05;
  LogicalType *type;
  _Hash_node_base *p_Var17;
  shared_ptr<duckdb::ClientContextState,_true> *state;
  shared_ptr<duckdb::ClientContextState,_true> *this_06;
  _func_int **pp_Var18;
  __node_base *p_Var19;
  long *local_428;
  shared_ptr<duckdb::PreparedStatementData,_true> prepared;
  undefined1 local_410 [16];
  shared_ptr<duckdb::Binder,_true> constant_binder;
  LogicalType value_type;
  BoundParameterData parameter_data;
  LogicalType return_type;
  BoundParameterData local_330;
  case_insensitive_map_t<BoundParameterData> bind_values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  ConstantBinder cbinder;
  string local_138;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_118;
  LogicalType local_e0;
  LogicalType local_c8;
  Value local_b0;
  Value local_70;
  
  iVar2 = (stmt->super_SQLStatement).named_param_map._M_h._M_element_count;
  pCVar8 = ClientData::Get(this->context);
  iVar9 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(pCVar8->prepared_statements)._M_h,&stmt->name);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    this_05 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&cbinder,"Prepared statement \"%s\" does not exist",
               (allocator *)&parameter_data);
    ::std::__cxx11::string::string((string *)&local_2a0,(string *)&stmt->name);
    BinderException::BinderException<std::__cxx11::string>(this_05,(string *)&cbinder,&local_2a0);
    __cxa_throw(this_05,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2> *)&prepared,
             (__shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)iVar9.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_true>
                    ._M_cur + 0x28));
  pPVar10 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&prepared);
  pSVar11 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
            operator->(&pPVar10->unbound_statement);
  PreparedStatement::
  VerifyParameters<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (&stmt->named_values,&pSVar11->named_param_map);
  bind_values._M_h._M_buckets = &bind_values._M_h._M_single_bucket;
  bind_values._M_h._M_bucket_count = 1;
  bind_values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  bind_values._M_h._M_element_count = 0;
  bind_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  bind_values._M_h._M_rehash_policy._M_next_resize = 0;
  bind_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
  CreateBinder((Binder *)&constant_binder,this->context,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
  pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->(&constant_binder);
  SetCanContainNulls(pBVar12,true);
  p_Var19 = &(stmt->named_values)._M_h._M_before_begin;
  while (p_Var19 = p_Var19->_M_nxt, p_Var19 != (__node_base *)0x0) {
    local_410._8_8_ = p_Var19;
    pPVar13 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)(p_Var19 + 5));
    EVar1 = (pPVar13->super_BaseExpression).type;
    binder = shared_ptr<duckdb::Binder,_true>::operator*(&constant_binder);
    pCVar3 = this->context;
    ::std::__cxx11::string::string
              ((string *)&local_138,"EXECUTE statement",(allocator *)&parameter_data);
    ConstantBinder::ConstantBinder(&cbinder,binder,pCVar3,&local_138);
    ::std::__cxx11::string::~string((string *)&local_138);
    ExpressionBinder::Bind
              ((ExpressionBinder *)local_410,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&cbinder,(LogicalType *)(p_Var19 + 5),false);
    BoundParameterData::BoundParameterData(&parameter_data);
    if (EVar1 == VALUE_CONSTANT) {
      this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_410);
      p_Var19 = (__node_base *)local_410._8_8_;
      pBVar14 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                          (&this_01->super_BaseExpression);
      LogicalType::LogicalType(&return_type);
      LogicalType::LogicalType(&value_type,VARCHAR);
      this_00 = &(pBVar14->super_Expression).return_type;
      bVar6 = LogicalType::operator==(this_00,&value_type);
      if (bVar6) {
        StringType::GetCollation_abi_cxx11_((string *)&local_330,(StringType *)this_00,type);
        peVar5 = local_330.value.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::~string((string *)&local_330);
        LogicalType::~LogicalType(&value_type);
        p_Var19 = (__node_base *)local_410._8_8_;
        if (peVar5 != (element_type *)0x0) goto LAB_005e6e61;
        LogicalType::LogicalType((LogicalType *)&local_330,STRING_LITERAL);
LAB_005e6e81:
        LogicalType::operator=(&return_type,(LogicalType *)&local_330);
        LogicalType::~LogicalType((LogicalType *)&local_330);
      }
      else {
        LogicalType::~LogicalType(&value_type);
LAB_005e6e61:
        bVar6 = LogicalType::IsIntegral(this_00);
        if (bVar6) {
          LogicalType::INTEGER_LITERAL((LogicalType *)&local_330,&pBVar14->value);
          goto LAB_005e6e81;
        }
        LogicalType::operator=(&return_type,&(pBVar14->value).type_);
      }
      Value::Value(&local_70,&pBVar14->value);
      LogicalType::LogicalType(&local_c8,&return_type);
      BoundParameterData::BoundParameterData(&local_330,&local_70,&local_c8);
      BoundParameterData::operator=(&parameter_data,&local_330);
      BoundParameterData::~BoundParameterData(&local_330);
      LogicalType::~LogicalType(&local_c8);
      Value::~Value(&local_70);
      LogicalType::~LogicalType(&return_type);
    }
    else {
      pCVar3 = this->context;
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_410);
      p_Var19 = (__node_base *)local_410._8_8_;
      ExpressionExecutor::EvaluateScalar((Value *)&return_type,pCVar3,expr,true);
      LogicalType::LogicalType(&value_type,&return_type);
      Value::Value(&local_b0,(Value *)&return_type);
      LogicalType::LogicalType(&local_e0,&value_type);
      BoundParameterData::BoundParameterData(&local_330,&local_b0,&local_e0);
      BoundParameterData::operator=(&parameter_data,&local_330);
      BoundParameterData::~BoundParameterData(&local_330);
      LogicalType::~LogicalType(&local_e0);
      Value::~Value(&local_b0);
      LogicalType::~LogicalType(&value_type);
      Value::~Value((Value *)&return_type);
    }
    this_02 = ::std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&bind_values,(key_type *)(p_Var19 + 1));
    BoundParameterData::operator=(this_02,&parameter_data);
    BoundParameterData::~BoundParameterData(&parameter_data);
    if ((Expression *)local_410._0_8_ != (Expression *)0x0) {
      (*((BaseExpression *)local_410._0_8_)->_vptr_BaseExpression[1])();
    }
    ConstantBinder::~ConstantBinder(&cbinder);
  }
  local_330.value.type_._0_8_ = (_Hash_node_base *)0x0;
  pPVar10 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&prepared);
  bVar6 = PreparedStatementData::RequireRebind(pPVar10,this->context,&bind_values);
  this_03 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
            ::operator->(&this->context->registered_state);
  RegisteredStateManager::States
            ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)&cbinder,this_03)
  ;
  for (this_06 = (shared_ptr<duckdb::ClientContextState,_true> *)
                 cbinder.super_ExpressionBinder._vptr_ExpressionBinder;
      this_06 !=
      (shared_ptr<duckdb::ClientContextState,_true> *)
      cbinder.super_ExpressionBinder.target_type._0_8_; this_06 = this_06 + 1) {
    parameter_data.value.type_._0_8_ =
         shared_ptr<duckdb::PreparedStatementData,_true>::operator*(&prepared);
    parameter_data.value.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&bind_values;
    pCVar15 = shared_ptr<duckdb::ClientContextState,_true>::operator->(this_06);
    iVar7 = (**(code **)(*(long *)pCVar15 + 0x70))(pCVar15,this->context,&parameter_data,bVar6);
    if (iVar7 == 1) {
      bVar6 = true;
    }
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
  ::~vector((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
             *)&cbinder);
  if (bVar6 == true) {
    Planner::Planner((Planner *)&cbinder,this->context);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&cbinder.super_ExpressionBinder.binder,&bind_values._M_h);
    pPVar10 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                        ((shared_ptr<duckdb::PreparedStatementData,_true> *)
                         ((long)iVar9.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_true>
                                ._M_cur + 0x28));
    pSVar11 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
              operator->(&pPVar10->unbound_statement);
    (*pSVar11->_vptr_SQLStatement[3])(&local_428,pSVar11);
    Planner::PrepareSQLStatement
              ((Planner *)&parameter_data,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               &cbinder);
    shared_ptr<duckdb::PreparedStatementData,_true>::operator=
              (&prepared,(shared_ptr<duckdb::PreparedStatementData,_true> *)&parameter_data);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parameter_data.value.type_.type_info_)
    ;
    if (local_428 != (long *)0x0) {
      (**(code **)(*local_428 + 8))();
    }
    pp_Var18 = cbinder.super_ExpressionBinder._vptr_ExpressionBinder;
    local_428 = (long *)0x0;
    cbinder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0;
    local_330.value.type_._0_8_ = pp_Var18;
    pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)&cbinder.clause._M_string_length);
    this->bound_tables = pBVar12->bound_tables;
    Planner::~Planner((Planner *)&cbinder);
  }
  else {
    pp_Var18 = (_func_int **)0x0;
  }
  this_04 = GetStatementProperties(this);
  pPVar10 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&prepared);
  StatementProperties::operator=(this_04,&pPVar10->properties);
  this_04->parameter_count = iVar2;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar10 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&prepared);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__return_storage_ptr__->names,
              &(pPVar10->names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  pPVar10 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&prepared);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(__return_storage_ptr__->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &(pPVar10->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pPVar10 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&prepared);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_118,&bind_values._M_h);
  PreparedStatementData::Bind(pPVar10,(case_insensitive_map_t<BoundParameterData> *)&local_118);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_118);
  if (pp_Var18 == (_func_int **)0x0) {
    make_uniq<duckdb::LogicalExecute,duckdb::shared_ptr<duckdb::PreparedStatementData,true>>
              ((duckdb *)&cbinder,&prepared);
    pp_Var18 = cbinder.super_ExpressionBinder._vptr_ExpressionBinder;
    cbinder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0;
    _Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (__return_storage_ptr__->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (__return_storage_ptr__->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)pp_Var18;
    if (_Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl ==
        (LogicalOperator *)0x0) goto LAB_005e728e;
    (**(code **)(*(long *)_Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                + 8))();
    p_Var17 = (_Hash_node_base *)cbinder.super_ExpressionBinder._vptr_ExpressionBinder;
  }
  else {
    make_uniq<duckdb::LogicalExecute,duckdb::shared_ptr<duckdb::PreparedStatementData,true>>
              ((duckdb *)&cbinder,&prepared);
    pLVar16 = unique_ptr<duckdb::LogicalExecute,_std::default_delete<duckdb::LogicalExecute>,_true>
              ::operator->((unique_ptr<duckdb::LogicalExecute,_std::default_delete<duckdb::LogicalExecute>,_true>
                            *)&cbinder);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                *)&(pLVar16->super_LogicalOperator).children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_330);
    pp_Var18 = cbinder.super_ExpressionBinder._vptr_ExpressionBinder;
    cbinder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0;
    _Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (__return_storage_ptr__->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (__return_storage_ptr__->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)pp_Var18;
    p_Var17 = (_Hash_node_base *)local_330.value.type_._0_8_;
    if ((_Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
         (LogicalOperator *)0x0) &&
       ((**(code **)(*(long *)_Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                              _M_head_impl + 8))(),
       p_Var17 = (_Hash_node_base *)local_330.value.type_._0_8_,
       cbinder.super_ExpressionBinder._vptr_ExpressionBinder != (_func_int **)0x0)) {
      (**(code **)(*cbinder.super_ExpressionBinder._vptr_ExpressionBinder + 8))();
      p_Var17 = (_Hash_node_base *)local_330.value.type_._0_8_;
    }
  }
  if (p_Var17 != (_Hash_node_base *)0x0) {
    (**(code **)&((((unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_> *)
                   &p_Var17->_M_nxt)->_M_t).
                  super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t
                  .super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
                  super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl)->binding_type)();
  }
LAB_005e728e:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constant_binder.internal.
              super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&bind_values._M_h);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&prepared.internal.
              super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(ExecuteStatement &stmt) {
	auto parameter_count = stmt.named_param_map.size();

	// bind the prepared statement
	auto &client_data = ClientData::Get(context);

	auto entry = client_data.prepared_statements.find(stmt.name);
	if (entry == client_data.prepared_statements.end()) {
		throw BinderException("Prepared statement \"%s\" does not exist", stmt.name);
	}

	// check if we need to rebind the prepared statement
	// this happens if the catalog changes, since in this case e.g. tables we relied on may have been deleted
	auto prepared = entry->second;
	auto &named_param_map = prepared->unbound_statement->named_param_map;

	PreparedStatement::VerifyParameters(stmt.named_values, named_param_map);

	auto &mapped_named_values = stmt.named_values;
	// bind any supplied parameters
	case_insensitive_map_t<BoundParameterData> bind_values;
	auto constant_binder = Binder::CreateBinder(context);
	constant_binder->SetCanContainNulls(true);
	for (auto &pair : mapped_named_values) {
		bool is_literal = pair.second->GetExpressionType() == ExpressionType::VALUE_CONSTANT;

		ConstantBinder cbinder(*constant_binder, context, "EXECUTE statement");
		auto bound_expr = cbinder.Bind(pair.second);
		BoundParameterData parameter_data;
		if (is_literal) {
			auto &constant = bound_expr->Cast<BoundConstantExpression>();
			LogicalType return_type;
			if (constant.return_type == LogicalTypeId::VARCHAR &&
			    StringType::GetCollation(constant.return_type).empty()) {
				return_type = LogicalTypeId::STRING_LITERAL;
			} else if (constant.return_type.IsIntegral()) {
				return_type = LogicalType::INTEGER_LITERAL(constant.value);
			} else {
				return_type = constant.value.type();
			}
			parameter_data = BoundParameterData(std::move(constant.value), std::move(return_type));
		} else {
			auto value = ExpressionExecutor::EvaluateScalar(context, *bound_expr, true);
			auto value_type = value.type();
			parameter_data = BoundParameterData(std::move(value), std::move(value_type));
		}
		bind_values[pair.first] = std::move(parameter_data);
	}
	unique_ptr<LogicalOperator> rebound_plan;

	RebindQueryInfo rebind = RebindQueryInfo::DO_NOT_REBIND;
	if (prepared->RequireRebind(context, bind_values)) {
		rebind = RebindQueryInfo::ATTEMPT_TO_REBIND;
	}
	for (auto &state : context.registered_state->States()) {
		BindPreparedStatementCallbackInfo info {*prepared, bind_values};
		auto new_rebind = state->OnRebindPreparedStatement(context, info, rebind);
		if (new_rebind == RebindQueryInfo::ATTEMPT_TO_REBIND) {
			rebind = RebindQueryInfo::ATTEMPT_TO_REBIND;
		}
	}
	if (rebind == RebindQueryInfo::ATTEMPT_TO_REBIND) {
		// catalog was modified or statement does not have clear types: rebind the statement before running the execute
		Planner prepared_planner(context);
		prepared_planner.parameter_data = bind_values;
		prepared = prepared_planner.PrepareSQLStatement(entry->second->unbound_statement->Copy());
		rebound_plan = std::move(prepared_planner.plan);
		D_ASSERT(prepared->properties.bound_all_parameters);
		this->bound_tables = prepared_planner.binder->bound_tables;
	}
	// copy the properties of the prepared statement into the planner
	auto &properties = GetStatementProperties();
	properties = prepared->properties;
	properties.parameter_count = parameter_count;

	BoundStatement result;
	result.names = prepared->names;
	result.types = prepared->types;

	prepared->Bind(std::move(bind_values));
	if (rebound_plan) {
		auto execute_plan = make_uniq<LogicalExecute>(std::move(prepared));
		execute_plan->children.push_back(std::move(rebound_plan));
		result.plan = std::move(execute_plan);
	} else {
		result.plan = make_uniq<LogicalExecute>(std::move(prepared));
	}
	return result;
}